

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::BaseTableRef::Deserialize(BaseTableRef *this,Deserializer *deserializer)

{
  _Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_> __ptr;
  _Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_> _Var1;
  uint uVar2;
  int iVar3;
  BaseTableRef *this_00;
  pointer pBVar4;
  _Head_base<0UL,_duckdb::AtClause_*,_false> __ptr_00;
  default_delete<duckdb::AtClause> *this_01;
  _Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_> local_60;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_58;
  _Head_base<0UL,_duckdb::AtClause_*,_false> local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (BaseTableRef *)operator_new(0xd0);
  BaseTableRef(this_00);
  local_58._M_head_impl = this_00;
  pBVar4 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"schema_name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_head_impl = (AtClause *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pBVar4->schema_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) goto LAB_0175bb55;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pBVar4->schema_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) {
LAB_0175bb55:
      operator_delete(local_50._M_head_impl);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pBVar4 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"table_name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_head_impl = (AtClause *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pBVar4->table_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) goto LAB_0175bbf6;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pBVar4->table_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) {
LAB_0175bbf6:
      operator_delete(local_50._M_head_impl);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pBVar4 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xca,"column_name_alias",&(pBVar4->super_TableRef).column_name_alias);
  pBVar4 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"catalog_name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_head_impl = (AtClause *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pBVar4->catalog_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) goto LAB_0175bcb9;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pBVar4->catalog_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) {
LAB_0175bcb9:
      operator_delete(local_50._M_head_impl);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pBVar4 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"at_clause");
  this_01 = (default_delete<duckdb::AtClause> *)&pBVar4->at_clause;
  if ((char)uVar2 == '\0') {
    __ptr_00._M_head_impl =
         (((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)this_01)->
         super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
         super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
         super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
    (((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)this_01)->
    super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
    super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
    super__Head_base<0UL,_duckdb::AtClause_*,_false> =
         (_Head_base<0UL,_duckdb::AtClause_*,_false>)0x0;
    if (__ptr_00._M_head_impl == (AtClause *)0x0) goto LAB_0175bd8b;
  }
  else {
    local_60.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::AtClause_*,_false>)(AtClause *)0x0;
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 != '\0') {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      AtClause::Deserialize((AtClause *)&local_50,deserializer);
      local_60.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::AtClause_*,_false>)
           (_Head_base<0UL,_duckdb::AtClause_*,_false>)local_50._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         local_60.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
    local_60.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::AtClause_*,_false>)(AtClause *)0x0;
    __ptr.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         (((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)this_01)->
         super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
         super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
         super__Head_base<0UL,_duckdb::AtClause_*,_false>;
    (((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)this_01)->
    super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
    super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
    super__Head_base<0UL,_duckdb::AtClause_*,_false> =
         _Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
    if ((__ptr.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl == (AtClause *)0x0) ||
       (::std::default_delete<duckdb::AtClause>::operator()
                  (this_01,(AtClause *)
                           __ptr.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl),
       local_60.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl == (AtClause *)0x0))
    goto LAB_0175bd8b;
    this_01 = (default_delete<duckdb::AtClause> *)&local_60;
    __ptr_00 = local_60.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
  }
  ::std::default_delete<duckdb::AtClause>::operator()(this_01,__ptr_00._M_head_impl);
LAB_0175bd8b:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> BaseTableRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BaseTableRef>(new BaseTableRef());
	deserializer.ReadPropertyWithDefault<string>(200, "schema_name", result->schema_name);
	deserializer.ReadPropertyWithDefault<string>(201, "table_name", result->table_name);
	deserializer.ReadPropertyWithDefault<vector<string>>(202, "column_name_alias", result->column_name_alias);
	deserializer.ReadPropertyWithDefault<string>(203, "catalog_name", result->catalog_name);
	deserializer.ReadPropertyWithDefault<unique_ptr<AtClause>>(204, "at_clause", result->at_clause);
	return std::move(result);
}